

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConstructSymbolTableVisitor.cpp
# Opt level: O3

void __thiscall
CConstructSymbolTableVisitor::Visit(CConstructSymbolTableVisitor *this,CAssignStm *stm)

{
  CIdExp *pCVar1;
  IExpression *pIVar2;
  
  pCVar1 = (stm->leftExpression)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>.
           _M_t.super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar1 != (CIdExp *)0x0) {
    (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
  }
  pIVar2 = (stm->rightExpression)._M_t.
           super___uniq_ptr_impl<IExpression,_std::default_delete<IExpression>_>._M_t.
           super__Tuple_impl<0UL,_IExpression_*,_std::default_delete<IExpression>_>.
           super__Head_base<0UL,_IExpression_*,_false>._M_head_impl;
  if (pIVar2 != (IExpression *)0x0) {
    (*(code *)*(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    return;
  }
  return;
}

Assistant:

void CConstructSymbolTableVisitor::Visit( CAssignStm &stm )
{
	if( stm.leftExpression ) {
		stm.leftExpression->Accept( *this );
	}
	if( stm.rightExpression ) {
		stm.rightExpression->Accept( *this );
	}
}